

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O1

void __thiscall
anon_unknown.dwarf_d5e806::TransformSelector::~TransformSelector(TransformSelector *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_TransformSelector = (_func_int **)&PTR__TransformSelector_0071a120;
  pcVar1 = (this->Tag)._M_dataplus._M_p;
  paVar2 = &(this->Tag).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~TransformSelector() = default;